

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysc_range_free(lysf_ctx *ctx,lysc_range *range)

{
  lysc_ext_instance *plVar1;
  long lVar2;
  void *pvVar3;
  
  if (range->parts != (lysc_range_part *)0x0) {
    free(&range->parts[-1].field_1);
  }
  lydict_remove(ctx->ctx,range->eapptag);
  lydict_remove(ctx->ctx,range->emsg);
  lydict_remove(ctx->ctx,range->dsc);
  lydict_remove(ctx->ctx,range->ref);
  plVar1 = range->exts;
  if (plVar1 != (lysc_ext_instance *)0x0) {
    pvVar3 = (void *)0xffffffffffffffff;
    lVar2 = 0;
    do {
      pvVar3 = (void *)((long)pvVar3 + 1);
      if (plVar1[-1].compiled <= pvVar3) {
        free(&plVar1[-1].compiled);
        return;
      }
      plVar1 = (lysc_ext_instance *)((long)&plVar1->def + lVar2);
      lVar2 = lVar2 + 0x48;
      lysc_ext_instance_free(ctx,plVar1);
      plVar1 = range->exts;
    } while (plVar1 != (lysc_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysc_range_free(struct lysf_ctx *ctx, struct lysc_range *range)
{
    LY_ARRAY_FREE(range->parts);
    lydict_remove(ctx->ctx, range->eapptag);
    lydict_remove(ctx->ctx, range->emsg);
    lydict_remove(ctx->ctx, range->dsc);
    lydict_remove(ctx->ctx, range->ref);
    FREE_ARRAY(ctx, range->exts, lysc_ext_instance_free);
}